

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_metric.cpp
# Opt level: O3

Reals __thiscall
Omega_h::interpolate_between_metrics(Omega_h *this,LO nmetrics,Reals *a,Reals *b,Real t)

{
  int *piVar1;
  Alloc *pAVar2;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  Reals RVar4;
  Reals log_c;
  Reals log_b;
  Reals log_a;
  Reals local_b8;
  Real local_a8;
  Reals local_a0;
  Reals local_90;
  Alloc *local_80;
  void *local_78;
  Reals local_70;
  Alloc *local_60;
  void *local_58;
  Reals local_50;
  Alloc *local_40;
  void *local_38;
  void *pvVar3;
  
  local_50.write_.shared_alloc_.alloc = (a->write_).shared_alloc_.alloc;
  if (((ulong)local_50.write_.shared_alloc_.alloc & 7) == 0 &&
      local_50.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_50.write_.shared_alloc_.alloc =
           (Alloc *)((local_50.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_50.write_.shared_alloc_.alloc)->use_count =
           (local_50.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_50.write_.shared_alloc_.direct_ptr = (a->write_).shared_alloc_.direct_ptr;
  local_a8 = t;
  linearize_metrics((Omega_h *)&local_40,nmetrics,&local_50);
  pAVar2 = local_50.write_.shared_alloc_.alloc;
  if (((ulong)local_50.write_.shared_alloc_.alloc & 7) == 0 &&
      local_50.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_50.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_50.write_.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
    }
  }
  local_70.write_.shared_alloc_.alloc = (b->write_).shared_alloc_.alloc;
  if (((ulong)local_70.write_.shared_alloc_.alloc & 7) == 0 &&
      local_70.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_70.write_.shared_alloc_.alloc =
           (Alloc *)((local_70.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_70.write_.shared_alloc_.alloc)->use_count =
           (local_70.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_70.write_.shared_alloc_.direct_ptr = (b->write_).shared_alloc_.direct_ptr;
  linearize_metrics((Omega_h *)&local_60,nmetrics,&local_70);
  pAVar2 = local_70.write_.shared_alloc_.alloc;
  if (((ulong)local_70.write_.shared_alloc_.alloc & 7) == 0 &&
      local_70.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_70.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_70.write_.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
    }
  }
  local_b8.write_.shared_alloc_.alloc = local_40;
  if (((ulong)local_40 & 7) == 0 && local_40 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_b8.write_.shared_alloc_.alloc = (Alloc *)(local_40->size * 8 + 1);
    }
    else {
      local_40->use_count = local_40->use_count + 1;
    }
  }
  local_b8.write_.shared_alloc_.direct_ptr = local_38;
  local_90.write_.shared_alloc_.alloc = local_60;
  if (((ulong)local_60 & 7) == 0 && local_60 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_90.write_.shared_alloc_.alloc = (Alloc *)(local_60->size * 8 + 1);
    }
    else {
      local_60->use_count = local_60->use_count + 1;
    }
  }
  local_90.write_.shared_alloc_.direct_ptr = local_58;
  interpolate_between((Omega_h *)&local_80,&local_b8,&local_90,local_a8);
  pAVar2 = local_90.write_.shared_alloc_.alloc;
  if (((ulong)local_90.write_.shared_alloc_.alloc & 7) == 0 &&
      local_90.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_90.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_90.write_.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
    }
  }
  pAVar2 = local_b8.write_.shared_alloc_.alloc;
  if (((ulong)local_b8.write_.shared_alloc_.alloc & 7) == 0 &&
      local_b8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_b8.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_b8.write_.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
    }
  }
  local_a0.write_.shared_alloc_.alloc = local_80;
  if (((ulong)local_80 & 7) == 0 && local_80 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_a0.write_.shared_alloc_.alloc = (Alloc *)(local_80->size * 8 + 1);
    }
    else {
      local_80->use_count = local_80->use_count + 1;
    }
  }
  local_a0.write_.shared_alloc_.direct_ptr = local_78;
  RVar4 = delinearize_metrics(this,nmetrics,&local_a0);
  pAVar2 = local_a0.write_.shared_alloc_.alloc;
  pvVar3 = RVar4.write_.shared_alloc_.direct_ptr;
  if (((ulong)local_a0.write_.shared_alloc_.alloc & 7) == 0 &&
      local_a0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_a0.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_a0.write_.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
      pvVar3 = extraout_RDX;
    }
  }
  if (((ulong)local_80 & 7) == 0 && local_80 != (Alloc *)0x0) {
    piVar1 = &local_80->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_80);
      operator_delete(local_80,0x48);
      pvVar3 = extraout_RDX_00;
    }
  }
  if (((ulong)local_60 & 7) == 0 && local_60 != (Alloc *)0x0) {
    piVar1 = &local_60->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_60);
      operator_delete(local_60,0x48);
      pvVar3 = extraout_RDX_01;
    }
  }
  if (((ulong)local_40 & 7) == 0 && local_40 != (Alloc *)0x0) {
    piVar1 = &local_40->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_40);
      operator_delete(local_40,0x48);
      pvVar3 = extraout_RDX_02;
    }
  }
  RVar4.write_.shared_alloc_.direct_ptr = pvVar3;
  RVar4.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Reals)RVar4.write_.shared_alloc_;
}

Assistant:

Reals interpolate_between_metrics(LO nmetrics, Reals a, Reals b, Real t) {
  auto log_a = linearize_metrics(nmetrics, a);
  auto log_b = linearize_metrics(nmetrics, b);
  auto log_c = interpolate_between(log_a, log_b, t);
  return delinearize_metrics(nmetrics, log_c);
}